

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O1

char * an(char *str)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  
  iVar1 = nextobuf_bufidx + 1 >> 0x1f;
  nextobuf_bufidx =
       nextobuf_bufidx + (((uint)((nextobuf_bufidx + 1) / 6 + iVar1) >> 1) - iVar1) * -0xc + 1;
  lVar2 = (long)nextobuf_bufidx * 0x100;
  pcVar4 = nextobuf_bufs + lVar2;
  nextobuf_bufs[lVar2] = 0;
  iVar1 = strncasecmp(str,"the ",4);
  if (iVar1 != 0) {
    iVar1 = strcmp(str,"molten lava");
    if (iVar1 != 0) {
      iVar1 = strcmp(str,"iron bars");
      if (iVar1 != 0) {
        iVar1 = strcmp(str,"muddy swamp");
        if (iVar1 != 0) {
          iVar1 = strcmp(str,"ice");
          if (iVar1 != 0) {
            pcVar3 = strchr("aeiouAEIOU",(int)*str);
            if (pcVar3 != (char *)0x0) {
              iVar1 = strncmp(str,"one-",4);
              if (iVar1 != 0) {
                iVar1 = strncmp(str,"useful",6);
                if (iVar1 != 0) {
                  iVar1 = strncmp(str,"unicorn",7);
                  if (iVar1 != 0) {
                    iVar1 = strncmp(str,"uranium",7);
                    if (iVar1 != 0) {
                      iVar1 = strncmp(str,"eucalyptus",10);
                      if (iVar1 != 0) {
                        builtin_strncpy(nextobuf_bufs + lVar2,"an ",4);
                        goto LAB_00202ea6;
                      }
                    }
                  }
                }
              }
            }
            nextobuf_bufs[lVar2 + 2] = 0;
            pcVar4[0] = 'a';
            pcVar4[1] = ' ';
          }
        }
      }
    }
  }
LAB_00202ea6:
  pcVar4 = strcat(pcVar4,str);
  return pcVar4;
}

Assistant:

char *an(const char *str)
{
	char *buf = nextobuf();

	buf[0] = '\0';

	if (strncmpi(str, "the ", 4) &&
	    strcmp(str, "molten lava") &&
	    strcmp(str, "iron bars") &&
	    strcmp(str, "muddy swamp") &&
	    strcmp(str, "ice")) {
		if (strchr(vowels, *str) &&
		    strncmp(str, "one-", 4) &&
		    strncmp(str, "useful", 6) &&
		    strncmp(str, "unicorn", 7) &&
		    strncmp(str, "uranium", 7) &&
		    strncmp(str, "eucalyptus", 10))
			strcpy(buf, "an ");
		else
			strcpy(buf, "a ");
	}

	strcat(buf, str);
	return buf;
}